

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void dense2csc(CUPDLPcsc *csc,CUPDLPdense *dense)

{
  double dVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *pcVar3;
  cupdlp_int cVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  cVar4 = dense->nCols;
  csc->nRows = dense->nRows;
  csc->nCols = cVar4;
  pcVar2 = csc->colMatBeg;
  *pcVar2 = 0;
  if (csc->nCols < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar7 = csc->nRows;
      if (0 < iVar7) {
        pcVar3 = dense->data;
        lVar8 = 0;
        do {
          dVar1 = pcVar3[(int)lVar6 * iVar7 + lVar8];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            csc->colMatIdx[iVar5] = (cupdlp_int)lVar8;
            iVar7 = csc->nRows;
            csc->colMatElem[iVar5] = pcVar3[(int)lVar6 * iVar7 + lVar8];
            iVar5 = iVar5 + 1;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar7);
      }
      pcVar2[lVar6 + 1] = iVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < csc->nCols);
  }
  csc->nMatElem = iVar5;
  return;
}

Assistant:

void dense2csc(CUPDLPcsc *csc, CUPDLPdense *dense) {
  csc->nRows = dense->nRows;
  csc->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csc->colMatBeg[0] = 0;
  for (iCol = 0; iCol < csc->nCols; ++iCol) {
    for (iRow = 0; iRow < csc->nRows; ++iRow) {
      if (dense->data[iCol * csc->nRows + iRow] != 0) {
        csc->colMatIdx[nnz] = iRow;
        csc->colMatElem[nnz] = dense->data[iCol * csc->nRows + iRow];
        ++nnz;
      }
    }
    csc->colMatBeg[iCol + 1] = nnz;
  }

  csc->nMatElem = nnz;

  return;
}